

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O3

OpenMDBitSet *
OpenMD::operator&(OpenMDBitSet *__return_storage_ptr__,OpenMDBitSet *bs1,OpenMDBitSet *bs2)

{
  undefined8 uVar1;
  undefined4 local_20;
  
  std::vector<bool,_std::allocator<bool>_>::vector(&__return_storage_ptr__->bitset_,&bs1->bitset_);
  uVar1 = (__return_storage_ptr__->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  local_20 = (undefined4)uVar1;
  std::
  transform<std::_Bit_const_iterator,std::_Bit_iterator,std::_Bit_iterator,std::logical_and<bool>>
            ((bs2->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
             (bs2->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
             (bs2->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,uVar1,0,local_20,
             0);
  return __return_storage_ptr__;
}

Assistant:

OpenMDBitSet operator&(const OpenMDBitSet& bs1, const OpenMDBitSet& bs2) {
    assert(bs1.size() == bs2.size());

    OpenMDBitSet result(bs1);
    result &= bs2;
    return result;
  }